

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

FlagMap * absl::internal::(anonymous_namespace)::GetFlagMap_abi_cxx11_(void)

{
  int iVar1;
  FlagMap *pFVar2;
  
  if (GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_);
    if (iVar1 != 0) {
      pFVar2 = (FlagMap *)operator_new(0x30);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<absl::internal::FlagFunc>_>_>_>
             *)0x4020f7);
      GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_ = pFVar2;
      __cxa_guard_release(&GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_);
    }
  }
  return GetFlagMap[abi:cxx11]()::flag_map_abi_cxx11_;
}

Assistant:

FlagMap *GetFlagMap() {
  static auto *flag_map = new FlagMap;
  return flag_map;
}